

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_dns_parse.c
# Opt level: O0

ares_status_t ares_dns_parse(uchar *buf,size_t buf_len,uint flags,ares_dns_record_t **dnsrec)

{
  ares_buf_t *buf_00;
  ares_status_t status;
  ares_buf_t *parser;
  ares_dns_record_t **dnsrec_local;
  uint flags_local;
  size_t buf_len_local;
  uchar *buf_local;
  
  if (((buf == (uchar *)0x0) || (buf_len == 0)) || (dnsrec == (ares_dns_record_t **)0x0)) {
    buf_local._4_4_ = ARES_EFORMERR;
  }
  else {
    buf_00 = ares_buf_create_const(buf,buf_len);
    if (buf_00 == (ares_buf_t *)0x0) {
      buf_local._4_4_ = ARES_ENOMEM;
    }
    else {
      buf_local._4_4_ = ares_dns_parse_buf(buf_00,flags,dnsrec);
      ares_buf_destroy(buf_00);
    }
  }
  return buf_local._4_4_;
}

Assistant:

ares_status_t ares_dns_parse(const unsigned char *buf, size_t buf_len,
                             unsigned int flags, ares_dns_record_t **dnsrec)
{
  ares_buf_t   *parser = NULL;
  ares_status_t status;

  if (buf == NULL || buf_len == 0 || dnsrec == NULL) {
    return ARES_EFORMERR;
  }

  parser = ares_buf_create_const(buf, buf_len);
  if (parser == NULL) {
    return ARES_ENOMEM;
  }

  status = ares_dns_parse_buf(parser, flags, dnsrec);
  ares_buf_destroy(parser);

  return status;
}